

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::INVALID_VERSION(Value *value,cmJSONState *state)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid \"version\" field",&local_39);
  cmJSONState::AddErrorAtValue(state,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void INVALID_VERSION(const Json::Value* value, cmJSONState* state)
{
  state->AddErrorAtValue("Invalid \"version\" field", value);
}